

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

void ompt_pre_init(void)

{
  int iVar1;
  char *pcVar2;
  ompt_start_tool_result_t *poVar3;
  long lVar4;
  code *pcVar5;
  char *libs;
  char *local_38;
  
  if (ompt_pre_init::ompt_pre_initialized == '\0') {
    ompt_pre_init::ompt_pre_initialized = '\x01';
    pcVar2 = getenv("OMP_TOOL");
    if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
      iVar1 = __kmp_str_match(pcVar2,0,"disabled");
      if (iVar1 != 0) {
        return;
      }
      iVar1 = __kmp_str_match(pcVar2,0,"enabled");
      if (iVar1 == 0) {
        fprintf(_stderr,
                "Warning: OMP_TOOL has invalid value \"%s\".\n  legal values are (NULL,\"\",\"disabled\",\"enabled\").\n"
                ,pcVar2);
        return;
      }
    }
    poVar3 = ompt_start_tool(0x3138b,"Intel(R) OMP version: 5.0.20140926");
    if (poVar3 == (ompt_start_tool_result_t *)0x0) {
      pcVar2 = getenv("OMP_TOOL_LIBRARIES");
      if (pcVar2 == (char *)0x0) {
        poVar3 = (ompt_start_tool_result_t *)0x0;
      }
      else {
        pcVar2 = __kmp_str_format("%s",pcVar2);
        libs = pcVar2;
        do {
          do {
            do {
              pcVar2 = __kmp_str_token(pcVar2,":",&local_38);
              poVar3 = (ompt_start_tool_result_t *)0x0;
              if (pcVar2 == (char *)0x0) goto LAB_0016a48f;
              lVar4 = dlopen(pcVar2,1);
              pcVar2 = (char *)0x0;
            } while (lVar4 == 0);
            pcVar5 = (code *)dlsym(lVar4,"ompt_start_tool");
            pcVar2 = (char *)0x0;
          } while (pcVar5 == (code *)0x0);
          poVar3 = (ompt_start_tool_result_t *)
                   (*pcVar5)(0x3138b,"Intel(R) OMP version: 5.0.20140926");
          pcVar2 = (char *)0x0;
        } while (poVar3 == (ompt_start_tool_result_t *)0x0);
LAB_0016a48f:
        __kmp_str_free(&libs);
      }
    }
    ompt_enabled = (ompt_callbacks_active_t)0x0;
    ompt_start_tool_result = poVar3;
  }
  return;
}

Assistant:

void ompt_pre_init() {
  //--------------------------------------------------
  // Execute the pre-initialization logic only once.
  //--------------------------------------------------
  static int ompt_pre_initialized = 0;

  if (ompt_pre_initialized)
    return;

  ompt_pre_initialized = 1;

  //--------------------------------------------------
  // Use a tool iff a tool is enabled and available.
  //--------------------------------------------------
  const char *ompt_env_var = getenv("OMP_TOOL");
  tool_setting_e tool_setting = omp_tool_error;

  if (!ompt_env_var || !strcmp(ompt_env_var, ""))
    tool_setting = omp_tool_unset;
  else if (OMPT_STR_MATCH(ompt_env_var, "disabled"))
    tool_setting = omp_tool_disabled;
  else if (OMPT_STR_MATCH(ompt_env_var, "enabled"))
    tool_setting = omp_tool_enabled;

#if OMPT_DEBUG
  printf("ompt_pre_init(): tool_setting = %d\n", tool_setting);
#endif
  switch (tool_setting) {
  case omp_tool_disabled:
    break;

  case omp_tool_unset:
  case omp_tool_enabled:

    //--------------------------------------------------
    // Load tool iff specified in environment variable
    //--------------------------------------------------
    ompt_start_tool_result =
        ompt_try_start_tool(__kmp_openmp_version, ompt_get_runtime_version());

    memset(&ompt_enabled, 0, sizeof(ompt_enabled));
    break;

  case omp_tool_error:
    fprintf(stderr, "Warning: OMP_TOOL has invalid value \"%s\".\n"
                    "  legal values are (NULL,\"\",\"disabled\","
                    "\"enabled\").\n",
            ompt_env_var);
    break;
  }
#if OMPT_DEBUG
  printf("ompt_pre_init(): ompt_enabled = %d\n", ompt_enabled);
#endif
}